

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark3.cpp
# Opt level: O2

pair<std::shared_ptr<hwnet::Buffer>,_int> * __thiscall
Codecc::Decode(pair<std::shared_ptr<hwnet::Buffer>,_int> *__return_storage_ptr__,Codecc *this)

{
  size_t sVar1;
  element_type *peVar2;
  element_type eVar3;
  size_t sVar4;
  ulong uVar5;
  ulong cap;
  undefined1 local_40 [8];
  Ptr b;
  
  sVar1 = this->r;
  uVar5 = this->w - sVar1;
  if (4 < uVar5) {
    peVar2 = (this->buffer).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    eVar3.ptr = ((peVar2->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ptr;
    sVar4 = peVar2->b;
    cap = (long)*(int *)(eVar3.ptr + sVar1 + sVar4) + 4;
    if (cap <= uVar5) {
      hwnet::Buffer::New((Buffer *)local_40,cap,0);
      hwnet::Buffer::Append((Buffer *)local_40,eVar3.ptr + sVar1 + sVar4,cap);
      this->r = this->r + cap;
      std::__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
                 (__shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_40);
      __return_storage_ptr__->second = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&b);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->first).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->second = 0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Buffer::Ptr,int> Decode() {
		size_t size = this->w - this->r;
		//std::cout << "decode " << this->w << "," << this->r << std::endl; 
		if(size > 4) {
			char *ptr = this->buffer->BuffPtr() + this->r;
			size_t len = (size_t)*(int*)&ptr[0];//包体大小
			if(size >= len+4) {
				Buffer::Ptr b = Buffer::New(len+4);
				b->Append(ptr,len+4);

				//int len = *(int*)&b->BuffPtr()[0];
				//int no = *(int*)&b->BuffPtr()[4];
				//std::cout << len << "," << no << "," << Buffer::New(b,8,b->Len())->ToString()  << std::endl;

				this->r += (len+4);
				return std::make_pair(b,0);
			}
		}
		return std::make_pair(nullptr,0);
	}